

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalNinjaGenerator::WriteNinjaRequiredVersion(cmLocalNinjaGenerator *this,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  long *plVar4;
  string requiredVersion;
  string local_60;
  char *local_40;
  long local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  
  local_30 = 0x332e31;
  local_38 = 3;
  local_40 = (char *)&local_30;
  bVar2 = cmGlobalNinjaGenerator::SupportsConsolePool
                    ((cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator);
  paVar1 = &local_60.field_2;
  if (bVar2) {
    local_60.field_2._M_allocated_capacity._0_4_ = 0x352e31;
    local_60._M_string_length = 3;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT44(local_60.field_2._M_allocated_capacity._4_4_,
                               local_60.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Minimal version of Ninja required by this file","");
  cmGlobalNinjaGenerator::WriteComment(os,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT44(local_60.field_2._M_allocated_capacity._4_4_,
                             local_60.field_2._M_allocated_capacity._0_4_) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"ninja_required_version = ",0x19);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_40,local_38);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (local_40 != (char *)&local_30) {
    operator_delete(local_40,CONCAT44(uStack_2c,local_30) + 1);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaRequiredVersion(std::ostream& os)
{
  // Default required version
  std::string requiredVersion =
    this->GetGlobalNinjaGenerator()->RequiredNinjaVersion();

  // Ninja generator uses the 'console' pool if available (>= 1.5)
  if (this->GetGlobalNinjaGenerator()->SupportsConsolePool()) {
    requiredVersion =
      this->GetGlobalNinjaGenerator()->RequiredNinjaVersionForConsolePool();
  }

  cmGlobalNinjaGenerator::WriteComment(
    os, "Minimal version of Ninja required by this file");
  os << "ninja_required_version = " << requiredVersion << std::endl
     << std::endl;
}